

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# words.c
# Opt level: O0

int32_t exp2s(int log)

{
  char cVar1;
  int32_t iVar2;
  uint in_EDI;
  uint32_t value;
  int in_stack_fffffffffffffff0;
  uint local_4;
  
  if ((int)in_EDI < 0) {
    iVar2 = exp2s(in_stack_fffffffffffffff0);
    local_4 = -iVar2;
  }
  else {
    cVar1 = (char)(in_EDI >> 8);
    if ((int)in_EDI >> 8 < 10) {
      local_4 = (""[(int)(in_EDI & 0xff)] | 0x100) >> (9U - cVar1 & 0x1f);
    }
    else {
      local_4 = (""[(int)(in_EDI & 0xff)] | 0x100) << (cVar1 - 9U & 0x1f);
    }
  }
  return local_4;
}

Assistant:

int32_t exp2s (int log)
{
    uint32_t value;

    if (log < 0)
        return -exp2s (-log);

    value = exp2_table [log & 0xff] | 0x100;

    if ((log >>= 8) <= 9)
        return value >> (9 - log);
    else
        return value << (log - 9);
}